

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O3

void __thiscall Datetime::operator++(Datetime *this,int param_1)

{
  time_t *ptVar1;
  int iVar2;
  int iVar3;
  int d;
  int hr;
  int mi;
  tm *ptVar4;
  Datetime tomorrow;
  Datetime local_c8;
  Datetime local_98;
  Datetime local_60;
  
  startOfDay(&local_60,this);
  local_c8._date = local_60._date + 0x15f91;
  local_c8._year = 0;
  local_c8._month = 0;
  local_c8._8_8_ = (ulong)(uint)weekstart << 0x20;
  local_c8._julian = 0;
  local_c8._day = 0;
  local_c8._seconds = 0;
  local_c8._offset = 0;
  local_c8._utc = false;
  startOfDay(&local_98,&local_c8);
  ptVar1 = &local_98._date;
  ptVar4 = localtime(ptVar1);
  iVar2 = ptVar4->tm_year;
  ptVar4 = localtime(ptVar1);
  iVar3 = ptVar4->tm_mon;
  ptVar4 = localtime(ptVar1);
  d = ptVar4->tm_mday;
  ptVar1 = &this->_date;
  ptVar4 = localtime(ptVar1);
  hr = ptVar4->tm_hour;
  ptVar4 = localtime(ptVar1);
  mi = ptVar4->tm_min;
  ptVar4 = localtime(ptVar1);
  Datetime(&local_c8,iVar2 + 0x76c,iVar3 + 1,d,hr,mi,ptVar4->tm_sec);
  this->_date = local_c8._date;
  return;
}

Assistant:

void Datetime::operator++ (int)
{
  Datetime tomorrow = (startOfDay () + 90001).startOfDay ();
  tomorrow = Datetime (tomorrow.year (),
                       tomorrow.month (),
                       tomorrow.day (),
                       hour (),
                       minute (),
                       second ());
  _date = tomorrow._date;
}